

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall intel_acbp_v2_t::key_signature_t::_read(key_signature_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  public_key_t *this_00;
  signature_t *this_01;
  unique_ptr<intel_acbp_v2_t::signature_t,_std::default_delete<intel_acbp_v2_t::signature_t>_>
  local_30 [3];
  unique_ptr<intel_acbp_v2_t::public_key_t,std::default_delete<intel_acbp_v2_t::public_key_t>>
  local_18 [8];
  key_signature_t *local_10;
  key_signature_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_key_id = uVar2;
  this_00 = (public_key_t *)operator_new(0x48);
  public_key_t::public_key_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
  std::unique_ptr<intel_acbp_v2_t::public_key_t,std::default_delete<intel_acbp_v2_t::public_key_t>>
  ::unique_ptr<std::default_delete<intel_acbp_v2_t::public_key_t>,void>(local_18,this_00);
  std::
  unique_ptr<intel_acbp_v2_t::public_key_t,_std::default_delete<intel_acbp_v2_t::public_key_t>_>::
  operator=(&this->m_public_key,
            (unique_ptr<intel_acbp_v2_t::public_key_t,_std::default_delete<intel_acbp_v2_t::public_key_t>_>
             *)local_18);
  std::
  unique_ptr<intel_acbp_v2_t::public_key_t,_std::default_delete<intel_acbp_v2_t::public_key_t>_>::
  ~unique_ptr((unique_ptr<intel_acbp_v2_t::public_key_t,_std::default_delete<intel_acbp_v2_t::public_key_t>_>
               *)local_18);
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_sig_scheme = uVar2;
  this_01 = (signature_t *)operator_new(0x48);
  signature_t::signature_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
  std::unique_ptr<intel_acbp_v2_t::signature_t,std::default_delete<intel_acbp_v2_t::signature_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::signature_t>,void>
            ((unique_ptr<intel_acbp_v2_t::signature_t,std::default_delete<intel_acbp_v2_t::signature_t>>
              *)local_30,this_01);
  std::unique_ptr<intel_acbp_v2_t::signature_t,_std::default_delete<intel_acbp_v2_t::signature_t>_>
  ::operator=(&this->m_signature,local_30);
  std::unique_ptr<intel_acbp_v2_t::signature_t,_std::default_delete<intel_acbp_v2_t::signature_t>_>
  ::~unique_ptr(local_30);
  return;
}

Assistant:

void intel_acbp_v2_t::key_signature_t::_read() {
    m_version = m__io->read_u1();
    m_key_id = m__io->read_u2le();
    m_public_key = std::unique_ptr<public_key_t>(new public_key_t(m__io, this, m__root));
    m_sig_scheme = m__io->read_u2le();
    m_signature = std::unique_ptr<signature_t>(new signature_t(m__io, this, m__root));
}